

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_encode_tiles_mt(AV1_COMP *cpi)

{
  AV1_COMP *cpi_00;
  long in_RDI;
  int num_workers;
  AV1_COMP *unaff_retaddr;
  int tile_rows;
  int tile_cols;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_00000030;
  int in_stack_000001a4;
  AV1_COMMON *in_stack_000001a8;
  MultiThreadInfo *in_stack_000001b0;
  int num_workers_00;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3bf80);
  num_workers_00 = (int)((ulong)(in_RDI + 0x9ae48) >> 0x20);
  if (*(int *)(in_RDI + 0x71320) < *(int *)(in_RDI + 0x42020) * *(int *)(in_RDI + 0x42024)) {
    av1_alloc_tile_data(unaff_retaddr);
  }
  av1_init_tile_data(in_stack_00000030);
  prepare_enc_workers(cpi,(AVxWorkerHook)cm,mt_info._4_4_);
  launch_workers((MultiThreadInfo *)cpi_00,num_workers_00);
  sync_enc_workers(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
  accumulate_counters_enc_workers(cpi_00,num_workers_00);
  return;
}

Assistant:

void av1_encode_tiles_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int num_workers = mt_info->num_mod_workers[MOD_ENC];

  assert(IMPLIES(cpi->tile_data == NULL,
                 cpi->allocated_tiles < tile_cols * tile_rows));
  if (cpi->allocated_tiles < tile_cols * tile_rows) av1_alloc_tile_data(cpi);

  av1_init_tile_data(cpi);
  num_workers = AOMMIN(num_workers, mt_info->num_workers);

  prepare_enc_workers(cpi, enc_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  accumulate_counters_enc_workers(cpi, num_workers);
}